

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuWorker.cpp
# Opt level: O0

void __thiscall xmrig::CpuWorker<2UL>::start(CpuWorker<2UL> *this)

{
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  Job *this_00;
  WorkerJob<2UL> *this_01;
  uint64_t uVar4;
  CpuWorker<2UL> *pCVar5;
  long in_RDI;
  Job *unaff_retaddr;
  size_t i;
  Job *job;
  CpuWorker<2UL> *in_stack_000000b0;
  CpuWorker<2UL> *in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  WorkerJob<2UL> *in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  Worker *in_stack_ffffffffffffffc0;
  ulong local_28;
  int local_14;
  uint8_t *in_stack_fffffffffffffff0;
  long lVar6;
  
  lVar6 = in_RDI;
  do {
    uVar3 = Nonce::sequence((Backend)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    if (uVar3 == 0) {
      return;
    }
    bVar1 = Nonce::isPaused();
    if (bVar1) {
      do {
        local_14 = 200;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&stack0xfffffffffffffff0,&local_14);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffffc0);
        bVar2 = Nonce::isPaused();
        bVar1 = false;
        if (bVar2) {
          uVar3 = Nonce::sequence((Backend)((ulong)in_stack_ffffffffffffff98 >> 0x20));
          bVar1 = uVar3 != 0;
        }
      } while (bVar1);
      uVar3 = Nonce::sequence((Backend)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      if (uVar3 == 0) {
        return;
      }
      consumeJob(in_stack_000000b0);
    }
    while( true ) {
      WorkerJob<2UL>::sequence((WorkerJob<2UL> *)(in_RDI + 0xb0));
      bVar1 = Nonce::isOutdated((Backend)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                (uint64_t)in_stack_ffffffffffffffa0);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      if ((*(ulong *)(in_RDI + 0x30) & 7) == 0) {
        Worker::storeStats(in_stack_ffffffffffffffc0);
      }
      this_00 = WorkerJob<2UL>::currentJob((WorkerJob<2UL> *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffffc0 = (Worker *)fn(in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff98 = WorkerJob<2UL>::blob((WorkerJob<2UL> *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffffa0 = (WorkerJob<2UL> *)Job::size(this_00);
      in_stack_ffffffffffffffa8 = in_RDI + 0x60;
      this_01 = (WorkerJob<2UL> *)(in_RDI + 0x50);
      uVar3 = Job::height(this_00);
      uVar4 = Job::extraIters(this_00);
      (*(code *)in_stack_ffffffffffffffc0)
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                 this_01,uVar3,uVar4);
      for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
        in_stack_ffffffffffffff90 = *(CpuWorker<2UL> **)(in_RDI + 0x78 + local_28 * 0x20);
        pCVar5 = (CpuWorker<2UL> *)Job::target(this_00);
        if (in_stack_ffffffffffffff90 < pCVar5) {
          WorkerJob<2UL>::nonce(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
          JobResults::submit(unaff_retaddr,(uint32_t)((ulong)lVar6 >> 0x20),
                             in_stack_fffffffffffffff0);
        }
      }
      WorkerJob<2UL>::nextRound
                (this_01,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffffa8);
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 2;
      std::this_thread::yield();
    }
    consumeJob(in_stack_000000b0);
  } while( true );
}

Assistant:

void xmrig::CpuWorker<N>::start()
{
    while (Nonce::sequence(Nonce::CPU) > 0) {
        if (Nonce::isPaused()) {
            do {
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
            }
            while (Nonce::isPaused() && Nonce::sequence(Nonce::CPU) > 0);

            if (Nonce::sequence(Nonce::CPU) == 0) {
                break;
            }

            consumeJob();
        }

        while (!Nonce::isOutdated(Nonce::CPU, m_job.sequence())) {
            if ((m_count & 0x7) == 0) {
                storeStats();
            }

            const Job &job = m_job.currentJob();

            fn()(m_job.blob(), job.size(), m_hash, m_ctx, job.height(), job.extraIters());

            for (size_t i = 0; i < N; ++i) {
                if (*reinterpret_cast<uint64_t*>(m_hash + (i * 32) + 24) < job.target()) {
                    JobResults::submit(job, *m_job.nonce(i), m_hash + (i * 32));
                }
            }

            m_job.nextRound(kReserveCount, 1);
            m_count += N;

            std::this_thread::yield();
        }

        consumeJob();
    }
}